

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execTasEa<(moira::Instr)124,(moira::Mode)2,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  undefined2 in_SI;
  Moira *in_RDI;
  u32 data;
  u32 ea;
  int dst;
  u32 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  int n;
  Moira *this_00;
  
  n = CONCAT22(in_SI,in_stack_fffffffffffffff4);
  this_00 = in_RDI;
  (*in_RDI->_vptr_Moira[0xb])();
  readOp<(moira::Mode)2,(moira::Size)1,0ul>
            (this_00,n,(u32 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (u32 *)in_RDI);
  bVar1 = NBIT<(moira::Size)1>((ulong)in_stack_ffffffffffffffe8);
  (in_RDI->reg).sr.n = bVar1;
  bVar1 = ZERO<(moira::Size)1>((ulong)in_stack_ffffffffffffffe8);
  (in_RDI->reg).sr.z = bVar1;
  (in_RDI->reg).sr.v = false;
  (in_RDI->reg).sr.c = false;
  bVar1 = isRegMode(MODE_AI);
  if (!bVar1) {
    (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
  }
  writeOp<(moira::Mode)2,(moira::Size)1,0ul>
            (in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
  prefetch<4ul>(in_RDI);
  return;
}

Assistant:

void
Moira::execTasEa(u16 opcode)
{
    signalTAS();

    int dst = ( _____________xxx(opcode) );

    u32 ea, data;
    readOp<M,Byte>(dst, ea, data);

    reg.sr.n = NBIT<Byte>(data);
    reg.sr.z = ZERO<Byte>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
    data |= 0x80;

    if (!isRegMode(M)) sync(2);
    writeOp <M,S> (dst, ea, data);

    prefetch<POLLIPL>();
}